

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

Bool prvTidyIsPushed(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  
  uVar1 = doc->lexer->istacksize;
  do {
    uVar1 = uVar1 - 1;
    if ((int)uVar1 < 0) {
      return no;
    }
  } while (doc->lexer->istack[uVar1 & 0x7fffffff].tag != node->tag);
  return yes;
}

Assistant:

Bool TY_(IsPushed)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;
    int i;

    for (i = lexer->istacksize - 1; i >= 0; --i)
    {
        if (lexer->istack[i].tag == node->tag)
            return yes;
    }

    return no;
}